

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DestroyImage::DestroyImage
          (DestroyImage *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DestroyImage_01e08798;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&this->m_image,image);
  local_28.m_ptr = &image->m_ptr->super_Object;
  local_28.m_state = image->m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_28);
  return;
}

Assistant:

DestroyImage::DestroyImage (SharedPtr<EGLImage> image, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
	, m_image	(image)
{
	modifyGLObject(SharedPtr<Object>(image));
}